

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectBlur.cpp
# Opt level: O1

bool __thiscall
Rml::FontEffectBlur::GetGlyphMetrics
          (FontEffectBlur *this,Vector2i *origin,Vector2i *dimensions,FontGlyph *param_3)

{
  int iVar1;
  int iVar2;
  
  iVar2 = dimensions->y * dimensions->x;
  if (0 < iVar2) {
    iVar1 = this->width;
    origin->x = origin->x - iVar1;
    origin->y = origin->y - iVar1;
    dimensions->y = dimensions->y + iVar1 * 2;
    dimensions->x = dimensions->x + iVar1 * 2;
  }
  return 0 < iVar2;
}

Assistant:

bool FontEffectBlur::GetGlyphMetrics(Vector2i& origin, Vector2i& dimensions, const FontGlyph& /*glyph*/) const
{
	if (dimensions.x * dimensions.y > 0)
	{
		origin.x -= width;
		origin.y -= width;

		dimensions.y += 2 * width;
		dimensions.x += 2 * width;

		return true;
	}

	return false;
}